

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O2

string * __thiscall cpp_sgr::sgr::toString_abi_cxx11_(string *__return_storage_ptr__,sgr *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 escape_abi_cxx11_,&this->str);
  std::operator+(__return_storage_ptr__,&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 terminator_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const { return escape + str + terminator; }